

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exorBits.c
# Opt level: O2

void PrepareBitSetModule(void)

{
  ulong uVar1;
  int *piVar2;
  long lVar3;
  
  for (uVar1 = 0; uVar1 != 0x10000; uVar1 = uVar1 + 1) {
    BitCount[uVar1] = ""[uVar1 >> 8 & 0xffffff] + ""[uVar1 & 0xff];
    BitGroupNumbers[uVar1] = 200;
  }
  piVar2 = SparseNumbers;
  for (lVar3 = 0; lVar3 != 0xa3; lVar3 = lVar3 + 1) {
    BitGroupNumbers[*piVar2] = (uchar)lVar3;
    piVar2 = piVar2 + 1;
  }
  return;
}

Assistant:

void PrepareBitSetModule()
// this function should be called before anything is done with the cube cover
{   
    // prepare bit count
    int i, k;
    int nLimit;
    
    nLimit = FULL16BITS;
    for ( i = 0; i < nLimit; i++ )
    {
        BitCount[i] = BitCount8[ i & 0xff ] + BitCount8[ i>>8 ];
        BitGroupNumbers[i] = MARKNUMBER;
    }
    // prepare bit groups
    for ( k = 0; k < 163; k++ )
        BitGroupNumbers[ SparseNumbers[k] ] = k;
/*
    // verify bit groups
    int n = 4368;
    char Buff[100];
    cout << "The number is " << n << endl;
    cout << "The binary is " << itoa(n,Buff,2) << endl;
    cout << "BitGroupNumbers[n] is " << (int)BitGroupNumbers[n] << endl;
    cout << "The group literals are ";
    for ( int g = 0; g < 4; g++ )
        cout << " " << (int)GroupLiterals[BitGroupNumbers[n]][g];
*/
}